

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O0

void __thiscall
sjtu::FileManager<std::pair<sjtu::orderType,_long>_>::save
          (FileManager<std::pair<sjtu::orderType,_long>_> *this,locType *offset)

{
  locType *in_RDI;
  LRUCache<std::pair<sjtu::orderType,_long>_> *unaff_retaddr;
  
  LRUCache<std::pair<sjtu::orderType,_long>_>::dirty_page_set(unaff_retaddr,in_RDI);
  return;
}

Assistant:

virtual void save(const locType &offset) override {cache -> dirty_page_set(offset);}